

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O1

void testTinySVDImp<double>(void)

{
  Matrix44<double> local_c8;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 1.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 1.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = -1.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 1.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[2][0] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[0][0] = 0.0;
  local_c8.x[0][1] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[0][0] = 0.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[2][0] = 1.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 1.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 1e-10;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 1e-10;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 100000.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 2.0;
  local_c8.x[0][2] = 3.0;
  local_c8.x[0][3] = 4.0;
  local_c8.x[1][0] = 5.0;
  local_c8.x[1][1] = 6.0;
  local_c8.x[1][2] = 7.0;
  local_c8.x[1][3] = 8.0;
  local_c8.x[2][0] = 9.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 2.0;
  local_c8.x[0][2] = 3.0;
  local_c8.x[0][3] = 4.0;
  local_c8.x[1][0] = 5.0;
  local_c8.x[1][1] = 6.0;
  local_c8.x[1][2] = 7.0;
  local_c8.x[1][3] = 8.0;
  local_c8.x[2][0] = 9.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 10000.0;
  local_c8.x[0][1] = 0.001;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.001;
  local_c8.x[1][0] = 1.0000000000000002e-10;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 62720.0;
  local_c8.x[0][1] = 73500.0;
  local_c8.x[0][2] = 4900.0;
  local_c8.x[0][3] = 5120.0;
  local_c8.x[1][0] = 6000.0;
  local_c8.x[1][1] = 400.0;
  local_c8.x[1][2] = 256.0;
  local_c8.x[1][3] = 300.0;
  local_c8.x[2][0] = 20.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 60026.0;
  local_c8.x[0][1] = 4902.0;
  local_c8.x[0][2] = 248.0;
  local_c8.x[0][3] = 4902.0;
  local_c8.x[1][0] = 404.0;
  local_c8.x[1][1] = 26.0;
  local_c8.x[1][2] = 248.0;
  local_c8.x[1][3] = 26.0;
  local_c8.x[2][0] = 10.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 0.0023588321752040036;
  local_c8.x[0][1] = -0.009655813148072904;
  local_c8.x[0][2] = 0.0010959850449366493;
  local_c8.x[0][3] = 0.008867182960804475;
  local_c8.x[1][0] = 0.0016771794267033666;
  local_c8.x[1][1] = -0.0043081475729438235;
  local_c8.x[1][2] = 0.003976050440932701;
  local_c8.x[1][3] = 0.0019880497026345716;
  local_c8.x[2][0] = 0.008957604661460197;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 2.3588321752040035e-09;
  local_c8.x[0][1] = -9.655813148072904e-09;
  local_c8.x[0][2] = 1.0959850449366498e-09;
  local_c8.x[0][3] = 8.867182960804475e-09;
  local_c8.x[1][0] = 1.6771794267033661e-09;
  local_c8.x[1][1] = -4.3081475729438225e-09;
  local_c8.x[1][2] = 3.976050440932702e-09;
  local_c8.x[1][3] = 1.988049702634572e-09;
  local_c8.x[2][0] = 8.957604661460196e-09;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = -0.46673855799602715;
  local_c8.x[0][1] = 0.6746626036031095;
  local_c8.x[0][2] = 0.97646986796449;
  local_c8.x[0][3] = -0.03246075374710372;
  local_c8.x[1][0] = 0.04658452774941828;
  local_c8.x[1][1] = 0.06743122864115114;
  local_c8.x[1][2] = -0.08888505522968781;
  local_c8.x[1][3] = 0.1280389179308779;
  local_c8.x[2][0] = 0.18532617511453064;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1e-08;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 1e-08;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 1e-08;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.00036;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 1e-18;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.00018;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.3;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.0003;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 1e-17;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.01;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.01;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 1.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.001;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 1e-06;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 0.5958863857013633;
  local_c8.x[0][1] = -0.7976123412610779;
  local_c8.x[0][2] = -1.0;
  local_c8.x[0][3] = 0.39194500425202045;
  local_c8.x[1][0] = 0.9176311538344036;
  local_c8.x[1][1] = -0.341818175044664;
  local_c8.x[1][2] = -0.45056075218951946;
  local_c8.x[1][3] = -0.712590577274251;
  local_c8.x[2][0] = 0.4712500821672027;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 4.38805348e-09;
  local_c8.x[0][1] = -2.53189691e-09;
  local_c8.x[0][2] = -4.65678607e-09;
  local_c8.x[0][3] = -3.23000099e-10;
  local_c8.x[1][0] = 1.86370294e-10;
  local_c8.x[1][1] = 3.42781192e-10;
  local_c8.x[1][2] = -4.61572824e-09;
  local_c8.x[1][3] = 2.6632645e-09;
  local_c8.x[2][0] = 4.89840346e-09;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0x1f4d97e5;
  uStack_3c = 0xbb5e3920;
  local_c8.x[0][0] = 0.0;
  local_c8.x[0][1] = -1.00000003e-22;
  local_38 = 0;
  uStack_34 = 0;
  uStack_30 = 0x9f3d9b30;
  uStack_2c = 0x3e7ad7f2;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 1.00000001e-07;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = (double)CONCAT44(uStack_44,local_48);
  local_c8.x[0][1] = (double)CONCAT44(uStack_3c,uStack_40);
  local_c8.x[0][2] = (double)CONCAT44(uStack_34,local_38);
  local_c8.x[0][3] = (double)CONCAT44(uStack_2c,uStack_30);
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 1.0;
  testTinySVD_3x3<double>((Matrix33<double> *)&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 1.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[2][2] = 1.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 1.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = -1.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[2][2] = 1.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 1.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 1.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[2][2] = 1.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 0.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 1.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[2][2] = 0.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 0.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[2][2] = 0.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[0][0] = 0.0;
  local_c8.x[0][1] = 0.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 0.0;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.0;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[2][2] = 0.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 0.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 1.0;
  local_c8.x[0][1] = 2.0;
  local_c8.x[0][2] = 3.0;
  local_c8.x[0][3] = 4.0;
  local_c8.x[1][0] = 5.0;
  local_c8.x[1][1] = 6.0;
  local_c8.x[1][2] = 7.0;
  local_c8.x[1][3] = 8.0;
  local_c8.x[2][0] = 9.0;
  local_c8.x[2][1] = 10.0;
  local_c8.x[2][2] = 11.0;
  local_c8.x[2][3] = 12.0;
  local_c8.x[3][0] = 13.0;
  local_c8.x[3][1] = 14.0;
  local_c8.x[3][2] = 15.0;
  local_c8.x[3][3] = 16.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = (double)CONCAT44(uStack_44,local_48);
  local_c8.x[0][1] = (double)CONCAT44(uStack_3c,uStack_40);
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 1e-07;
  local_c8.x[1][1] = 0.0;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[2][2] = 1.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 1.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 10000.0;
  local_c8.x[0][1] = 0.001;
  local_c8.x[0][2] = 0.0;
  local_c8.x[0][3] = 0.0;
  local_c8.x[1][0] = 0.001;
  local_c8.x[1][1] = 1.0000000000000002e-10;
  local_c8.x[1][2] = 0.0;
  local_c8.x[1][3] = 0.0;
  local_c8.x[2][0] = 0.0;
  local_c8.x[2][1] = 0.0;
  local_c8.x[2][2] = 0.0;
  local_c8.x[2][3] = 0.0;
  local_c8.x[3][0] = 0.0;
  local_c8.x[3][1] = 0.0;
  local_c8.x[3][2] = 0.0;
  local_c8.x[3][3] = 0.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 62720.0;
  local_c8.x[0][1] = 73500.0;
  local_c8.x[0][2] = 4900.0;
  local_c8.x[0][3] = 2450.0;
  local_c8.x[1][0] = 5120.0;
  local_c8.x[1][1] = 6000.0;
  local_c8.x[1][2] = 400.0;
  local_c8.x[1][3] = 2450.0;
  local_c8.x[2][0] = 256.0;
  local_c8.x[2][1] = 300.0;
  local_c8.x[2][2] = 20.0;
  local_c8.x[2][3] = 2450.0;
  local_c8.x[3][0] = 128.0;
  local_c8.x[3][1] = 150.0;
  local_c8.x[3][2] = 10.0;
  local_c8.x[3][3] = 5.0;
  testTinySVD_4x4<double>(&local_c8);
  local_c8.x[0][0] = 62750.0;
  local_c8.x[0][1] = 73560.0;
  local_c8.x[0][2] = 4990.0;
  local_c8.x[0][3] = 2540.0;
  local_c8.x[1][0] = 5130.0;
  local_c8.x[1][1] = 6020.0;
  local_c8.x[1][2] = 430.0;
  local_c8.x[1][3] = 2540.0;
  local_c8.x[2][0] = 266.0;
  local_c8.x[2][1] = 320.0;
  local_c8.x[2][2] = 50.0;
  local_c8.x[2][3] = 2540.0;
  local_c8.x[3][0] = 138.0;
  local_c8.x[3][1] = 170.0;
  local_c8.x[3][2] = 40.0;
  local_c8.x[3][3] = 35.0;
  testTinySVD_4x4<double>(&local_c8);
  return;
}

Assistant:

void
testTinySVDImp ()
{
    // Try a bunch of 3x3 matrices:
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 1);
    testTinySVD_3x3<T> (1, 0, 0, 0, -1, 0, 0, 0, 1);
    testTinySVD_3x3<T> (0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (0, 0, 0, 0, 0, 0, 0, 0, 1);
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, T(1e-10), 0, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, T(1e-10), 0, 0, 0, 0, 100000);
    testTinySVD_3x3<T> (1, 2, 3, 4, 5, 6, 7, 8, 9);
    testTinySVD_3x3<T> (1, 2, 3, 4, 5, 6, 7, 8, 9);
    testTinySVD_3x3<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (100, T(1e-5), 0),
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (100, T(1e-5), 0)));
    testTinySVD_3x3<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1),
        IMATH_INTERNAL_NAMESPACE::Vec3<T> (256, 300, 20)));
    testTinySVD_3x3<T> (
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1),
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (245, 20, 1)) +
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 2, 3),
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 2, 3)));

    // Some problematic matrices from SVDTest:
    testTinySVD_3x3<T> (
        T(0.0023588321752040036),
        T(-0.0096558131480729038),
        T(0.0010959850449366493),
        T(0.0088671829608044754),
        T(0.0016771794267033666),
        T(-0.0043081475729438235),
        T(0.003976050440932701),
        T(0.0019880497026345716),
        T(0.0089576046614601966));
    testTinySVD_3x3<T> (
        T(2.3588321752040035e-09),
        T(-9.6558131480729038e-09),
        T(1.0959850449366498e-09),
        T(8.8671829608044748e-09),
        T(1.6771794267033661e-09),
        T(-4.3081475729438225e-09),
        T(3.9760504409327016e-09),
        T(1.9880497026345722e-09),
        T(8.9576046614601957e-09));
    testTinySVD_3x3<T> (
        T(-0.46673855799602715),
        T(0.67466260360310948),
        T(0.97646986796448998),
        T(-0.032460753747103721),
        T(0.046584527749418278),
        T(0.067431228641151142),
        T(-0.088885055229687815),
        T(0.1280389179308779),
        T(0.18532617511453064));
    testTinySVD_3x3<T> (T(1e-8), 0, 0, 0, T(1e-8), 0, 0, 0, T(1e-8));
    testTinySVD_3x3<T> (1, 0, 0, 0, T(.00036), 0, T(1e-18), 0, T(.00018));
    testTinySVD_3x3<T> (T(1.3), 0, 0, 0, T(.0003), 0, T(1e-17), 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, T(1e-2), 0, 0, 0, T(1e-2));
    testTinySVD_3x3<T> (1, 0, 0, 0, 1, 0, 0, 0, 0);
    testTinySVD_3x3<T> (1, 0, 0, 0, T(1e-3), 0, 0, 0, T(1e-6));
    testTinySVD_3x3<T> (
        T(0.59588638570136332),
        T(-0.79761234126107794),
        -1,
        T(0.39194500425202045),
        T(0.91763115383440363),
        T(-0.341818175044664),
        T(-0.45056075218951946),
        T(-0.71259057727425101),
        T(0.47125008216720271));
    testTinySVD_3x3<T> (
        T(4.38805348e-09),
        T(-2.53189691e-09),
        T(-4.65678607e-09),
        T(-3.23000099e-10),
        T(1.86370294e-10),
        T(3.42781192e-10),
        T(-4.61572824e-09),
        T(2.6632645e-09),
        T(4.89840346e-09));
    // problematic 2x2 one for lapack on suse (see below), padded with 0's
    testTinySVD_3x3<T> (0, T(-1.00000003e-22), 0, T(1.00000001e-07), 0, 0, 0, 0, 0);
    // problematic 2x2 one for lapack on suse (see below), padded with 0's and 1
    testTinySVD_3x3<T> (0, T(-1.00000003e-22), 0, T(1.00000001e-07), 0, 0, 0, 0, 1);

    // Now, 4x4 matrices:
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, -1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0);
    testTinySVD_4x4<T> (1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16);
    testTinySVD_4x4<T> (
        0,
        T(-1.00000003e-22),
        0,
        0,
        T(00000001e-07),
        0,
        0,
        0,
        0,
        0,
        1,
        0,
        0,
        0,
        0,
        1);
    testTinySVD_4x4<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (100, T(1e-5), 0, 0),
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (100, T(1e-5), 0, 0)));
    testTinySVD_4x4<T> (outerProduct (
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (245, 20, 1, T(0.5)),
        IMATH_INTERNAL_NAMESPACE::Vec4<T> (256, 300, 20, 10)));
    testTinySVD_4x4<T> (
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (245, 20, 1, T(0.5)),
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (256, 300, 20, 10)) +
        outerProduct (
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (30, 10, 10, 10),
            IMATH_INTERNAL_NAMESPACE::Vec4<T> (1, 2, 3, 3)));
}